

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void mbedtls_strerror(int ret,char *buf,size_t buflen)

{
  uint uVar1;
  size_t sVar2;
  int use_ret;
  size_t len;
  size_t buflen_local;
  char *buf_local;
  int ret_local;
  
  if (buflen != 0) {
    memset(buf,0,buflen);
    buf_local._4_4_ = ret;
    if (ret < 0) {
      buf_local._4_4_ = -ret;
    }
    if ((buf_local._4_4_ & 0xff80) != 0) {
      uVar1 = buf_local._4_4_ & 0xff80;
      if (uVar1 == 0x6080) {
        snprintf(buf,buflen,"CIPHER - The selected feature is not available");
      }
      if (uVar1 == 0x6100) {
        snprintf(buf,buflen,"CIPHER - Bad input parameters");
      }
      if (uVar1 == 0x6180) {
        snprintf(buf,buflen,"CIPHER - Failed to allocate memory");
      }
      if (uVar1 == 0x6200) {
        snprintf(buf,buflen,"CIPHER - Input data contains invalid padding and is rejected");
      }
      if (uVar1 == 0x6280) {
        snprintf(buf,buflen,"CIPHER - Decryption of block requires a full block");
      }
      if (uVar1 == 0x6300) {
        snprintf(buf,buflen,"CIPHER - Authentication failed (for AEAD modes)");
      }
      if (uVar1 == 0x6380) {
        snprintf(buf,buflen,"CIPHER - The context is invalid. For example, because it was freed");
      }
      if (uVar1 == 0x6400) {
        snprintf(buf,buflen,"CIPHER - Cipher hardware accelerator failed");
      }
      if (uVar1 == 0x3080) {
        snprintf(buf,buflen,"DHM - Bad input parameters");
      }
      if (uVar1 == 0x3100) {
        snprintf(buf,buflen,"DHM - Reading of the DHM parameters failed");
      }
      if (uVar1 == 0x3180) {
        snprintf(buf,buflen,"DHM - Making of the DHM parameters failed");
      }
      if (uVar1 == 0x3200) {
        snprintf(buf,buflen,"DHM - Reading of the public values failed");
      }
      if (uVar1 == 0x3280) {
        snprintf(buf,buflen,"DHM - Making of the public value failed");
      }
      if (uVar1 == 0x3300) {
        snprintf(buf,buflen,"DHM - Calculation of the DHM secret failed");
      }
      if (uVar1 == 0x3380) {
        snprintf(buf,buflen,"DHM - The ASN.1 data is not formatted correctly");
      }
      if (uVar1 == 0x3400) {
        snprintf(buf,buflen,"DHM - Allocation of memory failed");
      }
      if (uVar1 == 0x3480) {
        snprintf(buf,buflen,"DHM - Read or write of file failed");
      }
      if (uVar1 == 0x3500) {
        snprintf(buf,buflen,"DHM - DHM hardware accelerator failed");
      }
      if (uVar1 == 0x3580) {
        snprintf(buf,buflen,"DHM - Setting the modulus and generator failed");
      }
      if (uVar1 == 0x4f80) {
        snprintf(buf,buflen,"ECP - Bad input parameters to function");
      }
      if (uVar1 == 0x4f00) {
        snprintf(buf,buflen,"ECP - The buffer is too small to write to");
      }
      if (uVar1 == 0x4e80) {
        snprintf(buf,buflen,
                 "ECP - The requested feature is not available, for example, the requested curve is not supported"
                );
      }
      if (uVar1 == 0x4e00) {
        snprintf(buf,buflen,"ECP - The signature is not valid");
      }
      if (uVar1 == 0x4d80) {
        snprintf(buf,buflen,"ECP - Memory allocation failed");
      }
      if (uVar1 == 0x4d00) {
        snprintf(buf,buflen,"ECP - Generation of random value, such as ephemeral key, failed");
      }
      if (uVar1 == 0x4c80) {
        snprintf(buf,buflen,"ECP - Invalid private or public key");
      }
      if (uVar1 == 0x4c00) {
        snprintf(buf,buflen,"ECP - The buffer contains a valid signature followed by more data");
      }
      if (uVar1 == 0x4b80) {
        snprintf(buf,buflen,"ECP - The ECP hardware accelerator failed");
      }
      if (uVar1 == 0x4b00) {
        snprintf(buf,buflen,
                 "ECP - Operation in progress, call again with the same parameters to continue");
      }
      if (uVar1 == 0x5080) {
        snprintf(buf,buflen,"MD - The selected feature is not available");
      }
      if (uVar1 == 0x5100) {
        snprintf(buf,buflen,"MD - Bad input parameters to function");
      }
      if (uVar1 == 0x5180) {
        snprintf(buf,buflen,"MD - Failed to allocate memory");
      }
      if (uVar1 == 0x5200) {
        snprintf(buf,buflen,"MD - Opening or reading of file failed");
      }
      if (uVar1 == 0x5280) {
        snprintf(buf,buflen,"MD - MD hardware accelerator failed");
      }
      if (uVar1 == 0x1080) {
        snprintf(buf,buflen,"PEM - No PEM header or footer found");
      }
      if (uVar1 == 0x1100) {
        snprintf(buf,buflen,"PEM - PEM string is not as expected");
      }
      if (uVar1 == 0x1180) {
        snprintf(buf,buflen,"PEM - Failed to allocate memory");
      }
      if (uVar1 == 0x1200) {
        snprintf(buf,buflen,"PEM - RSA IV is not in hex-format");
      }
      if (uVar1 == 0x1280) {
        snprintf(buf,buflen,"PEM - Unsupported key encryption algorithm");
      }
      if (uVar1 == 0x1300) {
        snprintf(buf,buflen,"PEM - Private key password can\'t be empty");
      }
      if (uVar1 == 0x1380) {
        snprintf(buf,buflen,"PEM - Given private key password does not allow for correct decryption"
                );
      }
      if (uVar1 == 0x1400) {
        snprintf(buf,buflen,"PEM - Unavailable feature, e.g. hashing/encryption combination");
      }
      if (uVar1 == 0x1480) {
        snprintf(buf,buflen,"PEM - Bad input parameters to function");
      }
      if (uVar1 == 0x3f80) {
        snprintf(buf,buflen,"PK - Memory allocation failed");
      }
      if (uVar1 == 0x3f00) {
        snprintf(buf,buflen,"PK - Type mismatch, eg attempt to encrypt with an ECDSA key");
      }
      if (uVar1 == 16000) {
        snprintf(buf,buflen,"PK - Bad input parameters to function");
      }
      if (uVar1 == 0x3e00) {
        snprintf(buf,buflen,"PK - Read/write of file failed");
      }
      if (uVar1 == 0x3d80) {
        snprintf(buf,buflen,"PK - Unsupported key version");
      }
      if (uVar1 == 0x3d00) {
        snprintf(buf,buflen,"PK - Invalid key tag or value");
      }
      if (uVar1 == 0x3c80) {
        snprintf(buf,buflen,"PK - Key algorithm is unsupported (only RSA and EC are supported)");
      }
      if (uVar1 == 0x3c00) {
        snprintf(buf,buflen,"PK - Private key password can\'t be empty");
      }
      if (uVar1 == 0x3b80) {
        snprintf(buf,buflen,"PK - Given private key password does not allow for correct decryption")
        ;
      }
      if (uVar1 == 0x3b00) {
        snprintf(buf,buflen,
                 "PK - The pubkey tag or value is invalid (only RSA and EC are supported)");
      }
      if (uVar1 == 0x3a80) {
        snprintf(buf,buflen,"PK - The algorithm tag or value is invalid");
      }
      if (uVar1 == 0x3a00) {
        snprintf(buf,buflen,"PK - Elliptic curve is unsupported (only NIST curves are supported)");
      }
      if (uVar1 == 0x3980) {
        snprintf(buf,buflen,"PK - Unavailable feature, e.g. RSA disabled for RSA key");
      }
      if (uVar1 == 0x3900) {
        snprintf(buf,buflen,"PK - The buffer contains a valid signature followed by more data");
      }
      if (uVar1 == 0x3880) {
        snprintf(buf,buflen,"PK - PK hardware accelerator failed");
      }
      if (uVar1 == 0x1f80) {
        snprintf(buf,buflen,"PKCS12 - Bad input parameters to function");
      }
      if (uVar1 == 0x1f00) {
        snprintf(buf,buflen,"PKCS12 - Feature not available, e.g. unsupported encryption scheme");
      }
      if (uVar1 == 0x1e80) {
        snprintf(buf,buflen,"PKCS12 - PBE ASN.1 data not as expected");
      }
      if (uVar1 == 0x1e00) {
        snprintf(buf,buflen,
                 "PKCS12 - Given private key password does not allow for correct decryption");
      }
      if (uVar1 == 0x2f80) {
        snprintf(buf,buflen,"PKCS5 - Bad input parameters to function");
      }
      if (uVar1 == 0x2f00) {
        snprintf(buf,buflen,"PKCS5 - Unexpected ASN.1 data");
      }
      if (uVar1 == 0x2e80) {
        snprintf(buf,buflen,"PKCS5 - Requested encryption or digest alg not available");
      }
      if (uVar1 == 0x2e00) {
        snprintf(buf,buflen,
                 "PKCS5 - Given private key password does not allow for correct decryption");
      }
      if (uVar1 == 0x4080) {
        snprintf(buf,buflen,"RSA - Bad input parameters to function");
      }
      if (uVar1 == 0x4100) {
        snprintf(buf,buflen,"RSA - Input data contains invalid padding and is rejected");
      }
      if (uVar1 == 0x4180) {
        snprintf(buf,buflen,"RSA - Something failed during generation of a key");
      }
      if (uVar1 == 0x4200) {
        snprintf(buf,buflen,"RSA - Key failed to pass the validity check of the library");
      }
      if (uVar1 == 0x4280) {
        snprintf(buf,buflen,"RSA - The public key operation failed");
      }
      if (uVar1 == 0x4300) {
        snprintf(buf,buflen,"RSA - The private key operation failed");
      }
      if (uVar1 == 0x4380) {
        snprintf(buf,buflen,"RSA - The PKCS#1 verification failed");
      }
      if (uVar1 == 0x4400) {
        snprintf(buf,buflen,"RSA - The output buffer for decryption is not large enough");
      }
      if (uVar1 == 0x4480) {
        snprintf(buf,buflen,"RSA - The random generator failed to generate non-zeros");
      }
      if (uVar1 == 0x4500) {
        snprintf(buf,buflen,
                 "RSA - The implementation does not offer the requested operation, for example, because of security violations or lack of functionality"
                );
      }
      if (uVar1 == 0x4580) {
        snprintf(buf,buflen,"RSA - RSA hardware accelerator failed");
      }
      sVar2 = strlen(buf);
      if (sVar2 == 0) {
        snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar1);
      }
    }
    uVar1 = buf_local._4_4_ & 0xffff007f;
    if (uVar1 != 0) {
      sVar2 = strlen(buf);
      len = buflen;
      buflen_local = (size_t)buf;
      if (sVar2 != 0) {
        if (buflen - sVar2 < 5) {
          return;
        }
        snprintf(buf + sVar2,buflen - sVar2," : ");
        buflen_local = (size_t)(buf + sVar2 + 3);
        len = buflen - (sVar2 + 3);
      }
      if (uVar1 == 0x20) {
        snprintf((char *)buflen_local,len,"AES - Invalid key length");
      }
      if (uVar1 == 0x22) {
        snprintf((char *)buflen_local,len,"AES - Invalid data input length");
      }
      if (uVar1 == 0x21) {
        snprintf((char *)buflen_local,len,"AES - Invalid input data");
      }
      if (uVar1 == 0x23) {
        snprintf((char *)buflen_local,len,
                 "AES - Feature not available. For example, an unsupported AES key size");
      }
      if (uVar1 == 0x25) {
        snprintf((char *)buflen_local,len,"AES - AES hardware accelerator failed");
      }
      if (uVar1 == 0x19) {
        snprintf((char *)buflen_local,len,"ARC4 - ARC4 hardware accelerator failed");
      }
      if (uVar1 == 0x60) {
        snprintf((char *)buflen_local,len,"ASN1 - Out of data when parsing an ASN1 data structure");
      }
      if (uVar1 == 0x62) {
        snprintf((char *)buflen_local,len,"ASN1 - ASN1 tag was of an unexpected value");
      }
      if (uVar1 == 100) {
        snprintf((char *)buflen_local,len,
                 "ASN1 - Error when trying to determine the length or invalid length");
      }
      if (uVar1 == 0x66) {
        snprintf((char *)buflen_local,len,"ASN1 - Actual length differs from expected length");
      }
      if (uVar1 == 0x68) {
        snprintf((char *)buflen_local,len,"ASN1 - Data is invalid");
      }
      if (uVar1 == 0x6a) {
        snprintf((char *)buflen_local,len,"ASN1 - Memory allocation failed");
      }
      if (uVar1 == 0x6c) {
        snprintf((char *)buflen_local,len,
                 "ASN1 - Buffer too small when writing ASN.1 data structure");
      }
      if (uVar1 == 0x2a) {
        snprintf((char *)buflen_local,len,"BASE64 - Output buffer too small");
      }
      if (uVar1 == 0x2c) {
        snprintf((char *)buflen_local,len,"BASE64 - Invalid character in input");
      }
      if (uVar1 == 2) {
        snprintf((char *)buflen_local,len,
                 "BIGNUM - An error occurred while reading from or writing to a file");
      }
      if (uVar1 == 4) {
        snprintf((char *)buflen_local,len,"BIGNUM - Bad input parameters to function");
      }
      if (uVar1 == 6) {
        snprintf((char *)buflen_local,len,
                 "BIGNUM - There is an invalid character in the digit string");
      }
      if (uVar1 == 8) {
        snprintf((char *)buflen_local,len,"BIGNUM - The buffer is too small to write to");
      }
      if (uVar1 == 10) {
        snprintf((char *)buflen_local,len,
                 "BIGNUM - The input arguments are negative or result in illegal output");
      }
      if (uVar1 == 0xc) {
        snprintf((char *)buflen_local,len,
                 "BIGNUM - The input argument for division is zero, which is not allowed");
      }
      if (uVar1 == 0xe) {
        snprintf((char *)buflen_local,len,"BIGNUM - The input arguments are not acceptable");
      }
      if (uVar1 == 0x10) {
        snprintf((char *)buflen_local,len,"BIGNUM - Memory allocation failed");
      }
      if (uVar1 == 0x16) {
        snprintf((char *)buflen_local,len,"BLOWFISH - Bad input data");
      }
      if (uVar1 == 0x18) {
        snprintf((char *)buflen_local,len,"BLOWFISH - Invalid data input length");
      }
      if (uVar1 == 0x17) {
        snprintf((char *)buflen_local,len,"BLOWFISH - Blowfish hardware accelerator failed");
      }
      if (uVar1 == 0x24) {
        snprintf((char *)buflen_local,len,"CAMELLIA - Bad input data");
      }
      if (uVar1 == 0x26) {
        snprintf((char *)buflen_local,len,"CAMELLIA - Invalid data input length");
      }
      if (uVar1 == 0x27) {
        snprintf((char *)buflen_local,len,"CAMELLIA - Camellia hardware accelerator failed");
      }
      if (uVar1 == 0xd) {
        snprintf((char *)buflen_local,len,"CCM - Bad input parameters to the function");
      }
      if (uVar1 == 0xf) {
        snprintf((char *)buflen_local,len,"CCM - Authenticated decryption failed");
      }
      if (uVar1 == 0x11) {
        snprintf((char *)buflen_local,len,"CCM - CCM hardware accelerator failed");
      }
      if (uVar1 == 0x51) {
        snprintf((char *)buflen_local,len,"CHACHA20 - Invalid input parameter(s)");
      }
      if (uVar1 == 0x53) {
        snprintf((char *)buflen_local,len,
                 "CHACHA20 - Feature not available. For example, s part of the API is not implemented"
                );
      }
      if (uVar1 == 0x55) {
        snprintf((char *)buflen_local,len,"CHACHA20 - Chacha20 hardware accelerator failed");
      }
      if (uVar1 == 0x54) {
        snprintf((char *)buflen_local,len,
                 "CHACHAPOLY - The requested operation is not permitted in the current state");
      }
      if (uVar1 == 0x56) {
        snprintf((char *)buflen_local,len,
                 "CHACHAPOLY - Authenticated decryption failed: data was not authentic");
      }
      if (uVar1 == 0x7a) {
        snprintf((char *)buflen_local,len,"CMAC - CMAC hardware accelerator failed");
      }
      if (uVar1 == 0x34) {
        snprintf((char *)buflen_local,len,"CTR_DRBG - The entropy source failed");
      }
      if (uVar1 == 0x36) {
        snprintf((char *)buflen_local,len,"CTR_DRBG - The requested random buffer length is too big"
                );
      }
      if (uVar1 == 0x38) {
        snprintf((char *)buflen_local,len,
                 "CTR_DRBG - The input (entropy + additional data) is too large");
      }
      if (uVar1 == 0x3a) {
        snprintf((char *)buflen_local,len,"CTR_DRBG - Read or write error in file");
      }
      if (uVar1 == 0x32) {
        snprintf((char *)buflen_local,len,"DES - The data input has an invalid length");
      }
      if (uVar1 == 0x33) {
        snprintf((char *)buflen_local,len,"DES - DES hardware accelerator failed");
      }
      if (uVar1 == 0x3c) {
        snprintf((char *)buflen_local,len,"ENTROPY - Critical entropy source failure");
      }
      if (uVar1 == 0x3e) {
        snprintf((char *)buflen_local,len,"ENTROPY - No more sources can be added");
      }
      if (uVar1 == 0x40) {
        snprintf((char *)buflen_local,len,"ENTROPY - No sources have been added to poll");
      }
      if (uVar1 == 0x3d) {
        snprintf((char *)buflen_local,len,"ENTROPY - No strong sources have been added to poll");
      }
      if (uVar1 == 0x3f) {
        snprintf((char *)buflen_local,len,"ENTROPY - Read/write error in file");
      }
      if (uVar1 == 1) {
        snprintf((char *)buflen_local,len,"ERROR - Generic error");
      }
      if (uVar1 == 0x6e) {
        snprintf((char *)buflen_local,len,"ERROR - This is a bug in the library");
      }
      if (uVar1 == 0x12) {
        snprintf((char *)buflen_local,len,"GCM - Authenticated decryption failed");
      }
      if (uVar1 == 0x13) {
        snprintf((char *)buflen_local,len,"GCM - GCM hardware accelerator failed");
      }
      if (uVar1 == 0x14) {
        snprintf((char *)buflen_local,len,"GCM - Bad input parameters to function");
      }
      if (uVar1 == 0x5f80) {
        snprintf((char *)buflen_local,len,"HKDF - Bad input parameters to function");
      }
      if (uVar1 == 3) {
        snprintf((char *)buflen_local,len,"HMAC_DRBG - Too many random requested in single call");
      }
      if (uVar1 == 5) {
        snprintf((char *)buflen_local,len,"HMAC_DRBG - Input too large (Entropy + additional)");
      }
      if (uVar1 == 7) {
        snprintf((char *)buflen_local,len,"HMAC_DRBG - Read/write error in file");
      }
      if (uVar1 == 9) {
        snprintf((char *)buflen_local,len,"HMAC_DRBG - The entropy source failed");
      }
      if (uVar1 == 0x2f) {
        snprintf((char *)buflen_local,len,"MD5 - MD5 hardware accelerator failed");
      }
      if (uVar1 == 0x2e) {
        snprintf((char *)buflen_local,len,"OID - OID is not found");
      }
      if (uVar1 == 0xb) {
        snprintf((char *)buflen_local,len,"OID - output buffer is too small");
      }
      if (uVar1 == 0x30) {
        snprintf((char *)buflen_local,len,"PADLOCK - Input data should be aligned");
      }
      if (uVar1 == 0x70) {
        snprintf((char *)buflen_local,len,"PLATFORM - Hardware accelerator failed");
      }
      if (uVar1 == 0x72) {
        snprintf((char *)buflen_local,len,
                 "PLATFORM - The requested feature is not supported by the platform");
      }
      if (uVar1 == 0x57) {
        snprintf((char *)buflen_local,len,"POLY1305 - Invalid input parameter(s)");
      }
      if (uVar1 == 0x59) {
        snprintf((char *)buflen_local,len,
                 "POLY1305 - Feature not available. For example, s part of the API is not implemented"
                );
      }
      if (uVar1 == 0x5b) {
        snprintf((char *)buflen_local,len,"POLY1305 - Poly1305 hardware accelerator failed");
      }
      if (uVar1 == 0x31) {
        snprintf((char *)buflen_local,len,"RIPEMD160 - RIPEMD160 hardware accelerator failed");
      }
      if (uVar1 == 0x35) {
        snprintf((char *)buflen_local,len,"SHA1 - SHA-1 hardware accelerator failed");
      }
      if (uVar1 == 0x73) {
        snprintf((char *)buflen_local,len,"SHA1 - SHA-1 input data was malformed");
      }
      if (uVar1 == 0x37) {
        snprintf((char *)buflen_local,len,"SHA256 - SHA-256 hardware accelerator failed");
      }
      if (uVar1 == 0x74) {
        snprintf((char *)buflen_local,len,"SHA256 - SHA-256 input data was malformed");
      }
      if (uVar1 == 0x39) {
        snprintf((char *)buflen_local,len,"SHA512 - SHA-512 hardware accelerator failed");
      }
      if (uVar1 == 0x75) {
        snprintf((char *)buflen_local,len,"SHA512 - SHA-512 input data was malformed");
      }
      if (uVar1 == 0x28) {
        snprintf((char *)buflen_local,len,"XTEA - The data input has an invalid length");
      }
      if (uVar1 == 0x29) {
        snprintf((char *)buflen_local,len,"XTEA - XTEA hardware accelerator failed");
      }
      sVar2 = strlen((char *)buflen_local);
      if (sVar2 == 0) {
        snprintf((char *)buflen_local,len,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar1);
      }
    }
  }
  return;
}

Assistant:

void mbedtls_strerror( int ret, char *buf, size_t buflen )
{
    size_t len;
    int use_ret;

    if( buflen == 0 )
        return;

    memset( buf, 0x00, buflen );

    if( ret < 0 )
        ret = -ret;

    if( ret & 0xFF80 )
    {
        use_ret = ret & 0xFF80;

        // High level error codes
        //
        // BEGIN generated code
#if defined(MBEDTLS_CIPHER_C)
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Bad input parameters" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Decryption of block requires a full block" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_AUTH_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Authentication failed (for AEAD modes)" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_CONTEXT) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The context is invalid. For example, because it was freed" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Cipher hardware accelerator failed" );
#endif /* MBEDTLS_CIPHER_C */

#if defined(MBEDTLS_DHM_C)
        if( use_ret == -(MBEDTLS_ERR_DHM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "DHM - Bad input parameters" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the public values failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the public value failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_CALC_SECRET_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Calculation of the DHM secret failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "DHM - The ASN.1 data is not formatted correctly" );
        if( use_ret == -(MBEDTLS_ERR_DHM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Allocation of memory failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "DHM - Read or write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - DHM hardware accelerator failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_SET_GROUP_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Setting the modulus and generator failed" );
#endif /* MBEDTLS_DHM_C */

#if defined(MBEDTLS_ECP_C)
        if( use_ret == -(MBEDTLS_ERR_ECP_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "ECP - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "ECP - The buffer is too small to write to" );
        if( use_ret == -(MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "ECP - The requested feature is not available, for example, the requested curve is not supported" );
        if( use_ret == -(MBEDTLS_ERR_ECP_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - The signature is not valid" );
        if( use_ret == -(MBEDTLS_ERR_ECP_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_RANDOM_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Generation of random value, such as ephemeral key, failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_INVALID_KEY) )
            mbedtls_snprintf( buf, buflen, "ECP - Invalid private or public key" );
        if( use_ret == -(MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "ECP - The buffer contains a valid signature followed by more data" );
        if( use_ret == -(MBEDTLS_ERR_ECP_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - The ECP hardware accelerator failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_IN_PROGRESS) )
            mbedtls_snprintf( buf, buflen, "ECP - Operation in progress, call again with the same parameters to continue" );
#endif /* MBEDTLS_ECP_C */

#if defined(MBEDTLS_MD_C)
        if( use_ret == -(MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "MD - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_MD_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "MD - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_MD_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "MD - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_MD_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "MD - Opening or reading of file failed" );
        if( use_ret == -(MBEDTLS_ERR_MD_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "MD - MD hardware accelerator failed" );
#endif /* MBEDTLS_MD_C */

#if defined(MBEDTLS_PEM_PARSE_C) || defined(MBEDTLS_PEM_WRITE_C)
        if( use_ret == -(MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) )
            mbedtls_snprintf( buf, buflen, "PEM - No PEM header or footer found" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - PEM string is not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PEM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PEM - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_ENC_IV) )
            mbedtls_snprintf( buf, buflen, "PEM - RSA IV is not in hex-format" );
        if( use_ret == -(MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG) )
            mbedtls_snprintf( buf, buflen, "PEM - Unsupported key encryption algorithm" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PEM - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PEM - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PEM - Unavailable feature, e.g. hashing/encryption combination" );
        if( use_ret == -(MBEDTLS_ERR_PEM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - Bad input parameters to function" );
#endif /* MBEDTLS_PEM_PARSE_C || MBEDTLS_PEM_WRITE_C */

#if defined(MBEDTLS_PK_C)
        if( use_ret == -(MBEDTLS_ERR_PK_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PK - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_TYPE_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Type mismatch, eg attempt to encrypt with an ECDSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PK - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PK_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "PK - Read/write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_VERSION) )
            mbedtls_snprintf( buf, buflen, "PK - Unsupported key version" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PK - Invalid key tag or value" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_PK_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - Key algorithm is unsupported (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PK - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_PUBKEY) )
            mbedtls_snprintf( buf, buflen, "PK - The pubkey tag or value is invalid (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - The algorithm tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE) )
            mbedtls_snprintf( buf, buflen, "PK - Elliptic curve is unsupported (only NIST curves are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PK - Unavailable feature, e.g. RSA disabled for RSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - The buffer contains a valid signature followed by more data" );
        if( use_ret == -(MBEDTLS_ERR_PK_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "PK - PK hardware accelerator failed" );
#endif /* MBEDTLS_PK_C */

#if defined(MBEDTLS_PKCS12_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Feature not available, e.g. unsupported encryption scheme" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - PBE ASN.1 data not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS12_C */

#if defined(MBEDTLS_PKCS5_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Unexpected ASN.1 data" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Requested encryption or digest alg not available" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS5_C */

#if defined(MBEDTLS_RSA_C)
        if( use_ret == -(MBEDTLS_ERR_RSA_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "RSA - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_RSA_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "RSA - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_GEN_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Something failed during generation of a key" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_CHECK_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Key failed to pass the validity check of the library" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The public key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PRIVATE_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The private key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The PKCS#1 verification failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE) )
            mbedtls_snprintf( buf, buflen, "RSA - The output buffer for decryption is not large enough" );
        if( use_ret == -(MBEDTLS_ERR_RSA_RNG_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The random generator failed to generate non-zeros" );
        if( use_ret == -(MBEDTLS_ERR_RSA_UNSUPPORTED_OPERATION) )
            mbedtls_snprintf( buf, buflen, "RSA - The implementation does not offer the requested operation, for example, because of security violations or lack of functionality" );
        if( use_ret == -(MBEDTLS_ERR_RSA_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - RSA hardware accelerator failed" );
#endif /* MBEDTLS_RSA_C */
        // END generated code

        if( strlen( buf ) == 0 )
            mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
    }

    use_ret = ret & ~0xFF80;

    if( use_ret == 0 )
        return;

    // If high level code is present, make a concatenation between both
    // error strings.
    //
    len = strlen( buf );

    if( len > 0 )
    {
        if( buflen - len < 5 )
            return;

        mbedtls_snprintf( buf + len, buflen - len, " : " );

        buf += len + 3;
        buflen -= len + 3;
    }

    // Low level error codes
    //
    // BEGIN generated code
#if defined(MBEDTLS_AES_C)
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_AES_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid input data" );
    if( use_ret == -(MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "AES - Feature not available. For example, an unsupported AES key size" );
    if( use_ret == -(MBEDTLS_ERR_AES_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "AES - AES hardware accelerator failed" );
#endif /* MBEDTLS_AES_C */

#if defined(MBEDTLS_ARC4_C)
    if( use_ret == -(MBEDTLS_ERR_ARC4_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "ARC4 - ARC4 hardware accelerator failed" );
#endif /* MBEDTLS_ARC4_C */

#if defined(MBEDTLS_ARIA_C)
    if( use_ret == -(MBEDTLS_ERR_ARIA_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "ARIA - Bad input data" );
    if( use_ret == -(MBEDTLS_ERR_ARIA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "ARIA - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_ARIA_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "ARIA - Feature not available. For example, an unsupported ARIA key size" );
    if( use_ret == -(MBEDTLS_ERR_ARIA_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "ARIA - ARIA hardware accelerator failed" );
#endif /* MBEDTLS_ARIA_C */

#if defined(MBEDTLS_ASN1_PARSE_C)
    if( use_ret == -(MBEDTLS_ERR_ASN1_OUT_OF_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Out of data when parsing an ASN1 data structure" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) )
        mbedtls_snprintf( buf, buflen, "ASN1 - ASN1 tag was of an unexpected value" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_LENGTH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Error when trying to determine the length or invalid length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_LENGTH_MISMATCH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Actual length differs from expected length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Data is invalid" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Memory allocation failed" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Buffer too small when writing ASN.1 data structure" );
#endif /* MBEDTLS_ASN1_PARSE_C */

#if defined(MBEDTLS_BASE64_C)
    if( use_ret == -(MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Output buffer too small" );
    if( use_ret == -(MBEDTLS_ERR_BASE64_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Invalid character in input" );
#endif /* MBEDTLS_BASE64_C */

#if defined(MBEDTLS_BIGNUM_C)
    if( use_ret == -(MBEDTLS_ERR_MPI_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - An error occurred while reading from or writing to a file" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_MPI_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - There is an invalid character in the digit string" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The buffer is too small to write to" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NEGATIVE_VALUE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are negative or result in illegal output" );
    if( use_ret == -(MBEDTLS_ERR_MPI_DIVISION_BY_ZERO) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input argument for division is zero, which is not allowed" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NOT_ACCEPTABLE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are not acceptable" );
    if( use_ret == -(MBEDTLS_ERR_MPI_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Memory allocation failed" );
#endif /* MBEDTLS_BIGNUM_C */

#if defined(MBEDTLS_BLOWFISH_C)
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Bad input data" );
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Blowfish hardware accelerator failed" );
#endif /* MBEDTLS_BLOWFISH_C */

#if defined(MBEDTLS_CAMELLIA_C)
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Bad input data" );
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Camellia hardware accelerator failed" );
#endif /* MBEDTLS_CAMELLIA_C */

#if defined(MBEDTLS_CCM_C)
    if( use_ret == -(MBEDTLS_ERR_CCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "CCM - Bad input parameters to the function" );
    if( use_ret == -(MBEDTLS_ERR_CCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "CCM - Authenticated decryption failed" );
    if( use_ret == -(MBEDTLS_ERR_CCM_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CCM - CCM hardware accelerator failed" );
#endif /* MBEDTLS_CCM_C */

#if defined(MBEDTLS_CHACHA20_C)
    if( use_ret == -(MBEDTLS_ERR_CHACHA20_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "CHACHA20 - Invalid input parameter(s)" );
    if( use_ret == -(MBEDTLS_ERR_CHACHA20_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "CHACHA20 - Feature not available. For example, s part of the API is not implemented" );
    if( use_ret == -(MBEDTLS_ERR_CHACHA20_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CHACHA20 - Chacha20 hardware accelerator failed" );
#endif /* MBEDTLS_CHACHA20_C */

#if defined(MBEDTLS_CHACHAPOLY_C)
    if( use_ret == -(MBEDTLS_ERR_CHACHAPOLY_BAD_STATE) )
        mbedtls_snprintf( buf, buflen, "CHACHAPOLY - The requested operation is not permitted in the current state" );
    if( use_ret == -(MBEDTLS_ERR_CHACHAPOLY_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "CHACHAPOLY - Authenticated decryption failed: data was not authentic" );
#endif /* MBEDTLS_CHACHAPOLY_C */

#if defined(MBEDTLS_CMAC_C)
    if( use_ret == -(MBEDTLS_ERR_CMAC_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CMAC - CMAC hardware accelerator failed" );
#endif /* MBEDTLS_CMAC_C */

#if defined(MBEDTLS_CTR_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The entropy source failed" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The requested random buffer length is too big" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The input (entropy + additional data) is too large" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Read or write error in file" );
#endif /* MBEDTLS_CTR_DRBG_C */

#if defined(MBEDTLS_DES_C)
    if( use_ret == -(MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "DES - The data input has an invalid length" );
    if( use_ret == -(MBEDTLS_ERR_DES_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "DES - DES hardware accelerator failed" );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_ENTROPY_C)
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Critical entropy source failure" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_MAX_SOURCES) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No more sources can be added" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No strong sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Read/write error in file" );
#endif /* MBEDTLS_ENTROPY_C */

#if defined(MBEDTLS_ERROR_C)
    if( use_ret == -(MBEDTLS_ERR_ERROR_GENERIC_ERROR) )
        mbedtls_snprintf( buf, buflen, "ERROR - Generic error" );
    if( use_ret == -(MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED) )
        mbedtls_snprintf( buf, buflen, "ERROR - This is a bug in the library" );
#endif /* MBEDTLS_ERROR_C */

#if defined(MBEDTLS_GCM_C)
    if( use_ret == -(MBEDTLS_ERR_GCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "GCM - Authenticated decryption failed" );
    if( use_ret == -(MBEDTLS_ERR_GCM_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "GCM - GCM hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_GCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "GCM - Bad input parameters to function" );
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_HKDF_C)
    if( use_ret == -(MBEDTLS_ERR_HKDF_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "HKDF - Bad input parameters to function" );
#endif /* MBEDTLS_HKDF_C */

#if defined(MBEDTLS_HMAC_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Too many random requested in single call" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Input too large (Entropy + additional)" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Read/write error in file" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - The entropy source failed" );
#endif /* MBEDTLS_HMAC_DRBG_C */

#if defined(MBEDTLS_MD2_C)
    if( use_ret == -(MBEDTLS_ERR_MD2_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "MD2 - MD2 hardware accelerator failed" );
#endif /* MBEDTLS_MD2_C */

#if defined(MBEDTLS_MD4_C)
    if( use_ret == -(MBEDTLS_ERR_MD4_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "MD4 - MD4 hardware accelerator failed" );
#endif /* MBEDTLS_MD4_C */

#if defined(MBEDTLS_MD5_C)
    if( use_ret == -(MBEDTLS_ERR_MD5_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "MD5 - MD5 hardware accelerator failed" );
#endif /* MBEDTLS_MD5_C */

#if defined(MBEDTLS_OID_C)
    if( use_ret == -(MBEDTLS_ERR_OID_NOT_FOUND) )
        mbedtls_snprintf( buf, buflen, "OID - OID is not found" );
    if( use_ret == -(MBEDTLS_ERR_OID_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "OID - output buffer is too small" );
#endif /* MBEDTLS_OID_C */

#if defined(MBEDTLS_PADLOCK_C)
    if( use_ret == -(MBEDTLS_ERR_PADLOCK_DATA_MISALIGNED) )
        mbedtls_snprintf( buf, buflen, "PADLOCK - Input data should be aligned" );
#endif /* MBEDTLS_PADLOCK_C */

#if defined(MBEDTLS_PLATFORM_C)
    if( use_ret == -(MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "PLATFORM - Hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED) )
        mbedtls_snprintf( buf, buflen, "PLATFORM - The requested feature is not supported by the platform" );
#endif /* MBEDTLS_PLATFORM_C */

#if defined(MBEDTLS_POLY1305_C)
    if( use_ret == -(MBEDTLS_ERR_POLY1305_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "POLY1305 - Invalid input parameter(s)" );
    if( use_ret == -(MBEDTLS_ERR_POLY1305_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "POLY1305 - Feature not available. For example, s part of the API is not implemented" );
    if( use_ret == -(MBEDTLS_ERR_POLY1305_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "POLY1305 - Poly1305 hardware accelerator failed" );
#endif /* MBEDTLS_POLY1305_C */

#if defined(MBEDTLS_RIPEMD160_C)
    if( use_ret == -(MBEDTLS_ERR_RIPEMD160_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "RIPEMD160 - RIPEMD160 hardware accelerator failed" );
#endif /* MBEDTLS_RIPEMD160_C */

#if defined(MBEDTLS_SHA1_C)
    if( use_ret == -(MBEDTLS_ERR_SHA1_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "SHA1 - SHA-1 hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_SHA1_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "SHA1 - SHA-1 input data was malformed" );
#endif /* MBEDTLS_SHA1_C */

#if defined(MBEDTLS_SHA256_C)
    if( use_ret == -(MBEDTLS_ERR_SHA256_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "SHA256 - SHA-256 hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_SHA256_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "SHA256 - SHA-256 input data was malformed" );
#endif /* MBEDTLS_SHA256_C */

#if defined(MBEDTLS_SHA512_C)
    if( use_ret == -(MBEDTLS_ERR_SHA512_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "SHA512 - SHA-512 hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_SHA512_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "SHA512 - SHA-512 input data was malformed" );
#endif /* MBEDTLS_SHA512_C */

#if defined(MBEDTLS_THREADING_C)
    if( use_ret == -(MBEDTLS_ERR_THREADING_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "THREADING - The selected feature is not available" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "THREADING - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_MUTEX_ERROR) )
        mbedtls_snprintf( buf, buflen, "THREADING - Locking / unlocking / free failed with error code" );
#endif /* MBEDTLS_THREADING_C */

#if defined(MBEDTLS_XTEA_C)
    if( use_ret == -(MBEDTLS_ERR_XTEA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "XTEA - The data input has an invalid length" );
    if( use_ret == -(MBEDTLS_ERR_XTEA_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "XTEA - XTEA hardware accelerator failed" );
#endif /* MBEDTLS_XTEA_C */
    // END generated code

    if( strlen( buf ) != 0 )
        return;

    mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
}